

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GyroscopeSensor.cpp
# Opt level: O3

bool __thiscall iDynTree::GyroscopeSensor::isValid(GyroscopeSensor *this)

{
  int iVar1;
  bool bVar2;
  long *local_38 [2];
  long local_28 [2];
  
  (*(this->super_LinkSensor).super_Sensor._vptr_Sensor[2])(local_38,this);
  iVar1 = std::__cxx11::string::compare((char *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  if (iVar1 == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = -1 < this->pimpl->parent_link_index;
  }
  return bVar2;
}

Assistant:

bool GyroscopeSensor::isValid() const
{
    if( this->getName() == "" )
    {
        return false;
    }

    if( this->pimpl->parent_link_index< 0 )
    {
        // Return false because the links is not appropriately setted
        return false;
    }


    return true;
}